

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p0709a.cpp
# Opt level: O2

error safe_divide(int i,int j)

{
  arithmetic_errc local_14;
  status_code_storage<system_error2::detail::erased<long,_true>_> local_10;
  
  if (j == 0) {
    local_14 = divide_by_zero;
  }
  else if (j == -1 && i == -0x80000000) {
    local_14 = integer_divide_overflows;
  }
  else if (i % j == 0) {
    local_14 = success;
  }
  else {
    local_14 = not_integer_division;
  }
  system_error2::errored_status_code<system_error2::detail::erased<long,_true>_>::
  errored_status_code<arithmetic_errc,_system_error2::status_code<_arithmetic_errc_domain>,_true>
            ((errored_status_code<system_error2::detail::erased<long,_true>_> *)&local_10,&local_14)
  ;
  return (status_code<system_error2::detail::erased<long,_true>_>)
         (status_code<system_error2::detail::erased<long,_true>_>)local_10;
}

Assistant:

error safe_divide(int i, int j)
{
  if(j == 0)
    return arithmetic_errc::divide_by_zero;
  if(i == INT_MIN && j == -1)
    return arithmetic_errc::integer_divide_overflows;
  if(i % j != 0)
    return arithmetic_errc::not_integer_division;
  return arithmetic_errc::success;
}